

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool google::ParseCallOffset(State *state)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  undefined4 uVar7;
  undefined2 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  int iVar14;
  short sVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  char *pcVar19;
  State copy;
  
  pcVar2 = state->mangled_cur;
  pcVar3 = state->out_cur;
  pcVar4 = state->out_begin;
  pcVar5 = state->out_end;
  pcVar6 = state->prev_name;
  uVar7 = state->prev_name_length;
  uVar8 = state->nest_level;
  uVar9 = state->append;
  uVar10 = state->overflowed;
  if (*state->mangled_cur == 'h') {
    state->mangled_cur = state->mangled_cur + 1;
    bVar17 = ParseNumber(state,(int *)0x0);
    if ((bVar17) && (pcVar19 = state->mangled_cur, *pcVar19 == '_')) goto LAB_0011b059;
  }
  state->mangled_cur = pcVar2;
  state->out_cur = pcVar3;
  state->prev_name = pcVar6;
  state->prev_name_length = uVar7;
  state->nest_level = uVar8;
  state->append = (bool)uVar9;
  state->overflowed = (bool)uVar10;
  state->out_begin = pcVar4;
  state->out_end = pcVar5;
  if (*state->mangled_cur == 'v') {
    state->mangled_cur = state->mangled_cur + 1;
    pcVar19 = state->mangled_cur;
    pcVar1 = state->out_cur;
    pcVar11 = state->out_begin;
    pcVar12 = state->out_end;
    pcVar13 = state->prev_name;
    iVar14 = state->prev_name_length;
    sVar15 = state->nest_level;
    bVar17 = state->append;
    bVar16 = state->overflowed;
    bVar18 = ParseNumber(state,(int *)0x0);
    if ((bVar18) && (*state->mangled_cur == '_')) {
      state->mangled_cur = state->mangled_cur + 1;
      bVar18 = ParseNumber(state,(int *)0x0);
      if (bVar18) {
        pcVar19 = state->mangled_cur;
        if (*pcVar19 == '_') {
LAB_0011b059:
          state->mangled_cur = pcVar19 + 1;
          return true;
        }
        goto LAB_0011b102;
      }
    }
    state->prev_name = pcVar13;
    state->prev_name_length = iVar14;
    state->nest_level = sVar15;
    state->append = bVar17;
    state->overflowed = bVar16;
    state->out_begin = pcVar11;
    state->out_end = pcVar12;
    state->mangled_cur = pcVar19;
    state->out_cur = pcVar1;
  }
LAB_0011b102:
  state->prev_name = pcVar6;
  state->prev_name_length = uVar7;
  state->nest_level = uVar8;
  state->append = (bool)uVar9;
  state->overflowed = (bool)uVar10;
  state->out_begin = pcVar4;
  state->out_end = pcVar5;
  state->mangled_cur = pcVar2;
  state->out_cur = pcVar3;
  return false;
}

Assistant:

static bool ParseCallOffset(State *state) {
  State copy = *state;
  if (ParseOneCharToken(state, 'h') &&
      ParseNVOffset(state) && ParseOneCharToken(state, '_')) {
    return true;
  }
  *state = copy;

  if (ParseOneCharToken(state, 'v') &&
      ParseVOffset(state) && ParseOneCharToken(state, '_')) {
    return true;
  }
  *state = copy;

  return false;
}